

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrapMode.cpp
# Opt level: O1

Function * wasm::generateBinaryFunc(Module *wasm,Binary *curr)

{
  Type TVar1;
  BinaryOp BVar2;
  BinaryOp BVar3;
  Expression *pEVar4;
  Expression *pEVar5;
  Binary *this;
  Const *pCVar6;
  Binary *pBVar7;
  Binary *this_00;
  Binary *this_01;
  Unary *this_02;
  If *this_03;
  ulong uVar8;
  optional<wasm::Type> type_;
  initializer_list<wasm::Type> types;
  Signature sig;
  optional<wasm::Type> type__00;
  Name NVar9;
  Name name;
  Literal local_118;
  Literal local_100;
  Literal local_e8;
  Literal local_d0;
  anon_union_16_6_1532cd5a_for_Literal_0 local_b8;
  undefined8 local_a8;
  Type local_a0;
  HeapType local_98;
  Binary *local_90;
  Const *local_88;
  anon_union_16_6_1532cd5a_for_Literal_0 local_80;
  undefined8 local_70;
  anon_union_16_6_1532cd5a_for_Literal_0 local_68;
  long local_58;
  Function *local_48;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  Builder local_38;
  Builder builder;
  
  func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._0_4_ = curr->op;
  TVar1.id = (curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
  func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._7_1_ = TVar1.id == 3;
  local_90 = curr;
  local_38.wasm = wasm;
  pEVar4 = (Expression *)MixedArena::allocSpace(&wasm->allocator,0x18,8);
  pEVar4->_id = LocalGetId;
  *(undefined4 *)(pEVar4 + 1) = 0;
  (pEVar4->type).id = TVar1.id;
  pEVar5 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  BVar2 = (BinaryOp)
          func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
  pEVar5->_id = LocalGetId;
  *(undefined4 *)(pEVar5 + 1) = 1;
  (pEVar5->type).id = TVar1.id;
  this = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this->op = BVar2;
  this->left = pEVar4;
  this->right = pEVar5;
  Binary::finalize(this);
  BVar3 = DivSInt32;
  if (TVar1.id == 3) {
    BVar3 = DivSInt64;
    local_b8.i64 = -0x8000000000000000;
    local_a8 = 3;
    local_80.i64 = 0;
    local_70 = 3;
  }
  else {
    local_b8.i32 = 0x80000000;
    local_a8 = 2;
    local_80.func.super_IString.str._M_len =
         (ulong)(uint)local_80.func.super_IString.str._M_len._4_4_ << 0x20;
    local_70 = 2;
  }
  if (BVar2 == BVar3) {
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._0_4_ = EqInt32;
    if (TVar1.id == 3) {
      local_68.i64 = -1;
      local_58 = 3;
      func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._0_4_ = EqInt64;
    }
    else {
      local_68.i32 = 0xffffffff;
      local_58 = 2;
    }
    pEVar4 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    pEVar4->_id = LocalGetId;
    *(undefined4 *)(pEVar4 + 1) = 0;
    (pEVar4->type).id = TVar1.id;
    Literal::Literal(&local_118,(Literal *)&local_b8.func);
    pCVar6 = Builder::makeConst(&local_38,&local_118);
    pBVar7 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar7->op = (BinaryOp)
                 func._M_t.
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    pBVar7->left = pEVar4;
    pBVar7->right = (Expression *)pCVar6;
    Binary::finalize(pBVar7);
    pEVar4 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    pEVar4->_id = LocalGetId;
    *(undefined4 *)(pEVar4 + 1) = 1;
    (pEVar4->type).id = TVar1.id;
    Literal::Literal(&local_100,(Literal *)&local_68.func);
    local_88 = Builder::makeConst(&local_38,&local_100);
    this_00 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_00->op = (BinaryOp)
                  func._M_t.
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    this_00->left = pEVar4;
    this_00->right = (Expression *)local_88;
    Binary::finalize(this_00);
    this_01 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_01->op = AndInt32;
    this_01->left = (Expression *)pBVar7;
    this_01->right = (Expression *)this_00;
    Binary::finalize(this_01);
    Literal::Literal(&local_e8,(Literal *)&local_80.func);
    pCVar6 = Builder::makeConst(&local_38,&local_e8);
    uVar8 = 0x28;
    pBVar7 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = IfId;
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    *(Binary **)&pBVar7->op = this_01;
    pBVar7->left = (Expression *)pCVar6;
    pBVar7->right = (Expression *)this;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar8;
    If::finalize((If *)pBVar7,type_);
    Literal::~Literal(&local_e8);
    Literal::~Literal(&local_100);
    Literal::~Literal(&local_118);
    Literal::~Literal((Literal *)&local_68.func);
    this = pBVar7;
  }
  types._M_len = 2;
  types._M_array = (iterator)&local_68;
  local_68.i64 = TVar1.id;
  local_68.func.super_IString.str._M_str = (char *)TVar1.id;
  Type::Type(&local_a0,types);
  NVar9 = getBinaryFuncName(local_90);
  sig.results.id = TVar1.id;
  sig.params.id = local_a0.id;
  HeapType::HeapType(&local_98,sig);
  local_68.i64 = 0;
  local_68.func.super_IString.str._M_str = (char *)0x0;
  local_58 = 0;
  name.super_IString.str._M_str = NVar9.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)&local_48;
  Builder::makeFunction
            (name,(HeapType)NVar9.super_IString.str._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_98.id,
             (Expression *)&local_68.func);
  if ((void *)local_68.i64 != (void *)0x0) {
    operator_delete(local_68.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_58 - local_68._0_8_);
  }
  pEVar4 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar4->_id = LocalGetId;
  *(undefined4 *)(pEVar4 + 1) = 1;
  (pEVar4->type).id = TVar1.id;
  this_02 = (Unary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
  (this_02->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
  (this_02->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
  this_02->op = func._M_t.
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._7_1_ | EqZInt32;
  this_02->value = pEVar4;
  Unary::finalize(this_02);
  Literal::Literal(&local_d0,(Literal *)&local_80.func);
  pCVar6 = Builder::makeConst(&local_38,&local_d0);
  uVar8 = 0x28;
  this_03 = (If *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (this_03->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
  (this_03->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
  this_03->condition = (Expression *)this_02;
  this_03->ifTrue = (Expression *)pCVar6;
  this_03->ifFalse = (Expression *)this;
  type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar8;
  If::finalize(this_03,type__00);
  local_48->body = (Expression *)this_03;
  Literal::~Literal(&local_d0);
  Literal::~Literal((Literal *)&local_80.func);
  Literal::~Literal((Literal *)&local_b8.func);
  return local_48;
}

Assistant:

Function* generateBinaryFunc(Module& wasm, Binary* curr) {
  BinaryOp op = curr->op;
  Type type = curr->type;
  bool isI64 = type == Type::i64;
  Builder builder(wasm);
  Expression* result = builder.makeBinary(
    op, builder.makeLocalGet(0, type), builder.makeLocalGet(1, type));
  BinaryOp divSIntOp = isI64 ? DivSInt64 : DivSInt32;
  UnaryOp eqZOp = isI64 ? EqZInt64 : EqZInt32;
  Literal minLit = isI64 ? Literal(std::numeric_limits<int64_t>::min())
                         : Literal(std::numeric_limits<int32_t>::min());
  Literal zeroLit = isI64 ? Literal(int64_t(0)) : Literal(int32_t(0));
  if (op == divSIntOp) {
    // guard against signed division overflow
    BinaryOp eqOp = isI64 ? EqInt64 : EqInt32;
    Literal negLit = isI64 ? Literal(int64_t(-1)) : Literal(int32_t(-1));
    result = builder.makeIf(
      builder.makeBinary(
        AndInt32,
        builder.makeBinary(
          eqOp, builder.makeLocalGet(0, type), builder.makeConst(minLit)),
        builder.makeBinary(
          eqOp, builder.makeLocalGet(1, type), builder.makeConst(negLit))),
      builder.makeConst(zeroLit),
      result);
  }
  auto funcSig = Signature({type, type}, type);
  auto func = Builder::makeFunction(getBinaryFuncName(curr), funcSig, {});
  func->body =
    builder.makeIf(builder.makeUnary(eqZOp, builder.makeLocalGet(1, type)),
                   builder.makeConst(zeroLit),
                   result);
  // TODO: use unique_ptr properly and do not release ownership.
  return func.release();
}